

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char * TEST_custom_callback(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  _test_data_t data;
  char *args [3];
  
  iVar1 = cargo_init(&cargo,0,"program");
  if (iVar1 == 0) {
    args[2] = "128x64";
    args[0] = "program";
    args[1] = "--alpha";
    cargo_set_flags(cargo,CARGO_AUTOCLEAN);
    iVar1 = cargo_add_option(cargo,0,"--alpha","The alpha","c",_test_cb,&data);
    if (iVar1 == 0) {
      cargo_parse(cargo,0,1,3,args);
      printf("%dx%d\n",(ulong)(uint)data.width,(ulong)(uint)data.height);
      if (data.width == 0x80) {
        pcVar2 = (char *)0x0;
        if (data.height != 0x40) {
          pcVar2 = "Height expected to be 128";
        }
      }
      else {
        pcVar2 = "Width expected to be 128";
      }
    }
    else {
      pcVar2 = "Failed to add options";
    }
    cargo_destroy(&cargo);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_custom_callback)
{
    _test_data_t data;
    char *args[] = { "program", "--alpha", "128x64" };

    cargo_set_flags(cargo, CARGO_AUTOCLEAN);

    ret |= cargo_add_option(cargo, 0, "--alpha", "The alpha", "c", _test_cb, &data);
    cargo_assert(ret == 0, "Failed to add options");

    ret = cargo_parse(cargo, 0, 1, sizeof(args) / sizeof(args[0]), args);
    printf("%dx%d\n", data.width, data.height);
    cargo_assert(data.width == 128, "Width expected to be 128");
    cargo_assert(data.height == 64, "Height expected to be 128");

    _TEST_CLEANUP();
}